

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O1

void Wln_WriteAddPos(Wln_Ntk_t *p)

{
  long lVar1;
  
  if (1 < (p->vTypes).nSize) {
    lVar1 = 1;
    do {
      if ((p->vTypes).pArray[lVar1] - 5U < 0xfffffffe) {
        Wln_ObjCreateCo(p,(int)lVar1);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < (p->vTypes).nSize);
  }
  return;
}

Assistant:

void Wln_WriteAddPos( Wln_Ntk_t * p )
{
    int iObj;
    Wln_NtkForEachObj( p, iObj )
        if ( !Wln_ObjIsCio(p, iObj) )
            Wln_ObjCreateCo( p, iObj );
}